

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
pstack::Reader::readObj<elf_prpsinfo>(Reader *this,Off offset,elf_prpsinfo *object,size_t count)

{
  int iVar1;
  undefined4 extraout_var;
  Exception *this_00;
  Exception *pEVar2;
  Exception local_1d0;
  long local_30;
  size_t rc;
  size_t count_local;
  elf_prpsinfo *object_local;
  Off offset_local;
  Reader *this_local;
  
  if (count != 0) {
    rc = count;
    count_local = (size_t)object;
    object_local = (elf_prpsinfo *)offset;
    offset_local = (Off)this;
    iVar1 = (*this->_vptr_Reader[2])(this,offset,count * 0x88,object);
    local_30 = CONCAT44(extraout_var,iVar1);
    if (local_30 != rc * 0x88) {
      this_00 = (Exception *)__cxa_allocate_exception();
      memset(&local_1d0,0,0x1a0);
      Exception::Exception(&local_1d0);
      pEVar2 = Exception::operator<<(&local_1d0,(char (*) [29])"incomplete object read from ");
      pEVar2 = Exception::operator<<(pEVar2,this);
      pEVar2 = Exception::operator<<(pEVar2,(char (*) [12])" at offset ");
      pEVar2 = Exception::operator<<(pEVar2,(unsigned_long *)&object_local);
      pEVar2 = Exception::operator<<(pEVar2,(char (*) [6])0x2a58c5);
      pEVar2 = Exception::operator<<(pEVar2,&rc);
      pEVar2 = Exception::operator<<(pEVar2,(char (*) [7])" bytes");
      Exception::Exception(this_00,pEVar2);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
  }
  return;
}

Assistant:

void
Reader::readObj(Off offset, Obj *object, size_t count) const
{
    if (count == 0)
        return;
    size_t rc = read(offset, count * sizeof *object, (char *)object);
    if (rc != count * sizeof *object)
        throw Exception() << "incomplete object read from " << *this
           << " at offset " << offset
           << " for " << count << " bytes";
}